

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiPVWRFromFile(ndicapi *pol,int port,char *filename)

{
  byte bVar1;
  bool bVar2;
  int i;
  int iVar3;
  FILE *__stream;
  long lVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  byte *__s;
  char hexdata [128];
  uchar buffer [1024];
  byte local_4b8 [1160];
  
  pol->ErrorCode = 0;
  __stream = fopen(filename,"rb");
  iVar9 = -1;
  if (__stream != (FILE *)0x0) {
    __s = local_4b8 + 0x80;
    memset(__s,0,0x400);
    fread(__s,1,0x400,__stream);
    iVar3 = ferror(__stream);
    fclose(__stream);
    if (iVar3 == 0) {
      uVar8 = 0;
      do {
        lVar4 = 0;
        do {
          bVar7 = __s[lVar4] >> 4;
          bVar5 = __s[lVar4] & 0xf;
          bVar6 = bVar7 + 0x30;
          bVar1 = bVar5 + 0x30;
          bVar7 = bVar7 + 0x37;
          if (bVar6 < 0x3a) {
            bVar7 = bVar6;
          }
          bVar6 = bVar5 + 0x37;
          if (bVar1 < 0x3a) {
            bVar6 = bVar1;
          }
          local_4b8[lVar4 * 2] = bVar7;
          local_4b8[lVar4 * 2 + 1] = bVar6;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x40);
        ndiCommand(pol,"PVWR:%02X%04X%.128s",port,uVar8 & 0xffffffff,local_4b8);
        if (pol->ErrorCode != 0) {
          return -1;
        }
        __s = __s + 0x40;
        bVar2 = uVar8 < 0x3c0;
        uVar8 = uVar8 + 0x40;
      } while (bVar2);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

ndicapiExport int ndiPVWRFromFile(ndicapi* pol, int port, char* filename)
{
  unsigned char buffer[1024];
  char hexdata[128];
  FILE* file;
  int addr;

  pol->ErrorCode = 0;

  file = fopen(filename, "rb");
  if (file == NULL)
  {
    return -1;
  }

  memset(buffer, 0, 1024);      // clear buffer to zero
  fread(buffer, 1, 1024, file); // read at most 1k from file
  if (ferror(file))
  {
    fclose(file);
    return -1;
  }
  fclose(file);

  for (addr = 0; addr < 1024; addr += 64)   // write in chunks of 64 bytes
  {
    ndiPVWR(pol, port, addr, ndiHexEncode(hexdata, &buffer[addr], 64));
    if (ndiGetError(pol) != NDI_OKAY)
    {
      return -1;
    }
  }

  return 0;
}